

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O2

void get_exts(void)

{
  GLubyte *pGVar1;
  long lVar2;
  
  if (GLVersion.major < 3) {
    exts = (char *)(*glad_glGetString)(0x1f03);
  }
  else {
    num_exts_i = 0;
    (*glad_glGetIntegerv)(0x821d,&num_exts_i);
    if (0 < (long)num_exts_i) {
      exts_i = (char **)realloc(exts_i,(long)num_exts_i << 3);
    }
    for (lVar2 = 0; lVar2 < num_exts_i; lVar2 = lVar2 + 1) {
      pGVar1 = (*glad_glGetStringi)(0x1f03,(GLuint)lVar2);
      exts_i[lVar2] = (char *)pGVar1;
    }
  }
  return;
}

Assistant:

static void get_exts(void) {
#ifdef _GLAD_IS_SOME_NEW_VERSION
    if(GLVersion.major < 3) {
#endif
        exts = (const char *)glGetString(GL_EXTENSIONS);
#ifdef _GLAD_IS_SOME_NEW_VERSION
    } else {
        int index;

        num_exts_i = 0;
        glGetIntegerv(GL_NUM_EXTENSIONS, &num_exts_i);
        if (num_exts_i > 0) {
            exts_i = (const char **)realloc((void *)exts_i, num_exts_i * sizeof *exts_i);
        }

        for(index = 0; index < num_exts_i; index++) {
            exts_i[index] = (const char*)glGetStringi(GL_EXTENSIONS, index);
        }
    }
#endif
}